

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O1

vorbis_info_residue * res0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long *__s;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  vorbis_info_residue0 *info;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  __s = (long *)calloc(1,0xb20);
  pvVar1 = vi->codec_setup;
  lVar6 = oggpack_read(opb,0x18);
  *__s = lVar6;
  lVar6 = oggpack_read(opb,0x18);
  __s[1] = lVar6;
  lVar6 = oggpack_read(opb,0x18);
  *(int *)(__s + 2) = (int)lVar6 + 1;
  lVar6 = oggpack_read(opb,6);
  uVar3 = (uint)lVar6 + 1;
  *(uint *)((long)__s + 0x14) = uVar3;
  lVar7 = oggpack_read(opb,8);
  uVar4 = (uint)lVar7;
  *(uint *)((long)__s + 0x1c) = uVar4;
  if (-1 < (int)uVar4) {
    uVar13 = 0;
    if ((uint)lVar6 < 0x7fffffff) {
      uVar14 = 0;
      uVar13 = 0;
      do {
        uVar8 = oggpack_read(opb,3);
        lVar6 = oggpack_read(opb,1);
        if ((int)lVar6 < 0) {
          uVar5 = 2;
        }
        else {
          if ((int)lVar6 != 0) {
            lVar6 = oggpack_read(opb,5);
            uVar5 = (uint)lVar6;
            if ((int)uVar5 < 0) {
              uVar5 = uVar5 >> 0x1e & 0xfffffffe;
              goto LAB_001e13b3;
            }
            uVar8 = (ulong)(uVar5 * 8 | (uint)uVar8);
          }
          *(int *)((long)__s + uVar14 * 4 + 0x20) = (int)uVar8;
          uVar5 = 0;
          iVar9 = 0;
          if ((int)uVar8 != 0) {
            iVar9 = 0;
            uVar11 = uVar8 & 0xffffffff;
            do {
              uVar12 = (uint)uVar8;
              iVar9 = iVar9 + (uVar12 & 1);
              uVar11 = uVar11 >> 1;
              uVar8 = uVar11;
            } while (1 < uVar12);
          }
          uVar13 = uVar13 + iVar9;
        }
LAB_001e13b3:
        if (uVar5 != 0) goto LAB_001e1473;
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar3);
    }
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        lVar6 = oggpack_read(opb,8);
        if ((int)lVar6 < 0) goto LAB_001e1473;
        *(int *)((long)__s + uVar14 * 4 + 0x120) = (int)lVar6;
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    if ((int)uVar4 < *(int *)((long)pvVar1 + 0x20)) {
      if (0 < (int)uVar13) {
        uVar14 = 0;
        do {
          iVar9 = *(int *)((long)__s + uVar14 * 4 + 0x120);
          if ((*(int *)((long)pvVar1 + 0x20) <= iVar9) ||
             (*(int *)(*(long *)((long)pvVar1 + (long)iVar9 * 8 + 0xb28) + 0x18) == 0))
          goto LAB_001e1473;
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      piVar2 = *(int **)((long)pvVar1 + (ulong)(uVar4 & 0x7fffffff) * 8 + 0xb28);
      iVar9 = *piVar2;
      if (0 < iVar9) {
        iVar9 = iVar9 + 1;
        iVar10 = 1;
        while (iVar10 = iVar10 * uVar3, iVar10 <= piVar2[2]) {
          iVar9 = iVar9 + -1;
          if (iVar9 < 2) {
            *(int *)(__s + 3) = iVar10;
            return __s;
          }
        }
      }
    }
  }
LAB_001e1473:
  memset(__s,0,0xb20);
  free(__s);
  return (vorbis_info_residue *)0x0;
}

Assistant:

vorbis_info_residue *res0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int j,acc=0;
  vorbis_info_residue0 *info=_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=vi->codec_setup;

  info->begin=oggpack_read(opb,24);
  info->end=oggpack_read(opb,24);
  info->grouping=oggpack_read(opb,24)+1;
  info->partitions=oggpack_read(opb,6)+1;
  info->groupbook=oggpack_read(opb,8);

  /* check for premature EOP */
  if(info->groupbook<0)goto errout;

  for(j=0;j<info->partitions;j++){
    int cascade=oggpack_read(opb,3);
    int cflag=oggpack_read(opb,1);
    if(cflag<0) goto errout;
    if(cflag){
      int c=oggpack_read(opb,5);
      if(c<0) goto errout;
      cascade|=(c<<3);
    }
    info->secondstages[j]=cascade;

    acc+=icount(cascade);
  }
  for(j=0;j<acc;j++){
    int book=oggpack_read(opb,8);
    if(book<0) goto errout;
    info->booklist[j]=book;
  }

  if(info->groupbook>=ci->books)goto errout;
  for(j=0;j<acc;j++){
    if(info->booklist[j]>=ci->books)goto errout;
    if(ci->book_param[info->booklist[j]]->maptype==0)goto errout;
  }

  /* verify the phrasebook is not specifying an impossible or
     inconsistent partitioning scheme. */
  /* modify the phrasebook ranging check from r16327; an early beta
     encoder had a bug where it used an oversized phrasebook by
     accident.  These files should continue to be playable, but don't
     allow an exploit */
  {
    int entries = ci->book_param[info->groupbook]->entries;
    int dim = ci->book_param[info->groupbook]->dim;
    int partvals = 1;
    if (dim<1) goto errout;
    while(dim>0){
      partvals *= info->partitions;
      if(partvals > entries) goto errout;
      dim--;
    }
    info->partvals = partvals;
  }

  return(info);
 errout:
  res0_free_info(info);
  return(NULL);
}